

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

mat4 * mat4_multiply_n(mat4 *__return_storage_ptr__,int count,...)

{
  mat4 m1;
  mat4 m2;
  undefined8 __src;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM3_Da;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 in_stack_fffffffffffffe38;
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined4 local_178;
  undefined4 local_168;
  undefined4 local_158;
  undefined4 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined1 local_f0 [8];
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined1 local_6c [64];
  int local_2c;
  undefined4 local_28;
  int i;
  va_list args;
  int count_local;
  
  if (in_AL != '\0') {
    local_178 = in_XMM0_Da;
    local_168 = in_XMM1_Da;
    local_158 = in_XMM2_Da;
    local_148 = in_XMM3_Da;
    local_138 = in_XMM4_Qa;
    local_128 = in_XMM5_Qa;
    local_118 = in_XMM6_Qa;
    local_108 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = local_1a8;
  args[0]._0_8_ = &stack0x00000008;
  i = 0x30;
  local_28 = 0x10;
  local_198 = in_RDX;
  local_190 = in_RCX;
  local_188 = in_R8;
  local_180 = in_R9;
  args[0].reg_save_area._4_4_ = count;
  mat4_identity();
  for (local_2c = 0; __src = args[0]._0_8_, local_2c < args[0].reg_save_area._4_4_;
      local_2c = local_2c + 1) {
    args[0]._0_8_ = args[0]._0_8_ + 0x40;
    memcpy(&local_b0,(void *)__src,0x40);
    memcpy(local_f0,__return_storage_ptr__,0x40);
    m1.m[2] = (float)(undefined4)local_e0;
    m1.m[3] = (float)local_e0._4_4_;
    m1.m[0] = (float)(undefined4)uStack_e8;
    m1.m[1] = (float)uStack_e8._4_4_;
    m1.m[4] = (float)(undefined4)uStack_d8;
    m1.m[5] = (float)uStack_d8._4_4_;
    m1.m[6] = (float)(undefined4)local_d0;
    m1.m[7] = (float)local_d0._4_4_;
    m1.m[8] = (float)(undefined4)uStack_c8;
    m1.m[9] = (float)uStack_c8._4_4_;
    m1.m[10] = (float)(undefined4)local_c0;
    m1.m[0xb] = (float)local_c0._4_4_;
    m1.m[0xc] = (float)(undefined4)uStack_b8;
    m1.m[0xd] = (float)uStack_b8._4_4_;
    m1.m[0xe] = (float)(undefined4)local_b0;
    m1.m[0xf] = (float)local_b0._4_4_;
    m2.m[2] = (float)(undefined4)local_a0;
    m2.m[3] = (float)local_a0._4_4_;
    m2.m[0] = (float)(undefined4)uStack_a8;
    m2.m[1] = (float)uStack_a8._4_4_;
    m2.m[4] = (float)(undefined4)uStack_98;
    m2.m[5] = (float)uStack_98._4_4_;
    m2.m[6] = (float)(undefined4)local_90;
    m2.m[7] = (float)local_90._4_4_;
    m2.m[8] = (float)(undefined4)uStack_88;
    m2.m[9] = (float)uStack_88._4_4_;
    m2.m[10] = (float)(undefined4)local_80;
    m2.m[0xb] = (float)local_80._4_4_;
    m2.m[0xc] = (float)(undefined4)uStack_78;
    m2.m[0xd] = (float)uStack_78._4_4_;
    m2.m[0xe] = (float)(int)in_stack_fffffffffffffe38;
    m2.m[0xf] = (float)(int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
    mat4_multiply(m1,m2);
    memcpy(__return_storage_ptr__,local_6c,0x40);
  }
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4_multiply_n(int count, ...) {
    va_list args;
    va_start(args, count);
    mat4 result = mat4_identity();
    for (int i = 0; i < count; i++) {
        result = mat4_multiply(result, va_arg(args, mat4));
    }
    va_end(args);
    return result;
}